

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_can_do(mbedtls_ecp_group_id gid)

{
  undefined4 local_c;
  mbedtls_ecp_group_id gid_local;
  
  if (gid == MBEDTLS_ECP_DP_CURVE25519) {
    local_c = 0;
  }
  else if (gid == MBEDTLS_ECP_DP_CURVE448) {
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int mbedtls_ecdsa_can_do( mbedtls_ecp_group_id gid )
{
    switch( gid )
    {
#ifdef MBEDTLS_ECP_DP_CURVE25519_ENABLED
        case MBEDTLS_ECP_DP_CURVE25519: return 0;
#endif
#ifdef MBEDTLS_ECP_DP_CURVE448_ENABLED
        case MBEDTLS_ECP_DP_CURVE448: return 0;
#endif
    default: return 1;
    }
}